

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm.c
# Opt level: O2

PGMData * binaryPGM(PGMData *data)

{
  float fVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar2 = (ulong)(uint)data->row;
  if (data->row < 1) {
    uVar2 = 0;
  }
  for (uVar3 = 0; uVar3 != uVar2; uVar3 = uVar3 + 1) {
    uVar4 = (ulong)(uint)data->col;
    if (data->col < 1) {
      uVar4 = 0;
    }
    for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      fVar1 = data->pixel_matrix[uVar3][uVar5];
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        data->pixel_matrix[uVar3][uVar5] = 1.0;
      }
    }
  }
  data->max_greyscale = 1;
  return data;
}

Assistant:

PGMData *binaryPGM(PGMData *data)
{
    for (int i = 0; i < data->row; i++)
    {
        for (int j = 0; j < data->col; j++)
        {
            if (data->pixel_matrix[i][j] != 0)
                data->pixel_matrix[i][j] = 1;
        }
    }

    data->max_greyscale = 1;

    return data;
}